

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptSamplerDeclarationDX9(HlslGrammar *this,TType *param_1)

{
  bool bVar1;
  undefined1 local_48 [8];
  HlslToken name;
  TType *param_1_local;
  HlslGrammar *this_local;
  
  name.field_2 = (anon_union_8_5_54ae9b2d_for_HlslToken_2)param_1;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSampler);
  if (bVar1) {
    unimplemented(this,"Direct3D 9 sampler declaration");
    HlslToken::HlslToken((HlslToken *)local_48);
    bVar1 = acceptIdentifier(this,(HlslToken *)local_48);
    if (bVar1) {
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
      if (!bVar1) {
        expected(this,"=");
      }
    }
    else {
      expected(this,"sampler name");
    }
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptSamplerDeclarationDX9(TType& /*type*/)
{
    if (! acceptTokenClass(EHTokSampler))
        return false;

    // TODO: remove this when DX9 style declarations are implemented.
    unimplemented("Direct3D 9 sampler declaration");

    // read sampler name
    HlslToken name;
    if (! acceptIdentifier(name)) {
        expected("sampler name");
        return false;
    }

    if (! acceptTokenClass(EHTokAssign)) {
        expected("=");
        return false;
    }

    return false;
}